

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O3

bool_t EqData(datatype Type,void *a,void *b,size_t Size)

{
  long lVar1;
  long lVar2;
  int iVar3;
  bool_t bVar4;
  size_t sVar5;
  bool bVar6;
  
  if ((long)Type < 0x1f) {
    if (Type == 3) {
      if (b != (void *)0x0 && a != (void *)0x0) {
        lVar1 = *(long *)((long)a + 8);
        lVar2 = *(long *)((long)b + 8);
        if (((lVar1 != lVar2) || (bVar6 = true, *a != *b)) &&
           (bVar6 = lVar2 == 0 && lVar1 == 0, lVar2 != 0 && lVar1 != 0)) {
          bVar6 = lVar2 * *a - lVar1 * *b == 0;
        }
        return (ulong)bVar6;
      }
    }
    else {
      if (Type == 4) goto LAB_0010d4ff;
      if (Type == 0x1e) {
        bVar4 = ArrayEq((array *)a,(array *)b);
        return bVar4;
      }
    }
  }
  else if (Type - 0x1f < 2) {
LAB_0010d4ff:
    if (a == (void *)0x0) {
      a = "";
    }
    if (b == (void *)0x0) {
      b = "";
    }
    iVar3 = tcscmp((tchar_t *)a,(tchar_t *)b);
    goto LAB_0010d51f;
  }
  if (a == (void *)0x0 && b == (void *)0x0) {
    return 1;
  }
  if (a == (void *)0x0 || b == (void *)0x0) {
    if (a != (void *)0x0) {
      b = a;
    }
    if (Size == 0) {
      return 1;
    }
    sVar5 = 0;
    do {
      if (*(char *)((long)b + sVar5) != '\0') {
        return 0;
      }
      sVar5 = sVar5 + 1;
    } while (Size != sVar5);
    return 1;
  }
  iVar3 = bcmp(a,b,Size);
LAB_0010d51f:
  return (ulong)(iVar3 == 0);
}

Assistant:

static NOINLINE bool_t EqData(datatype Type, const void* a, const void* b, size_t Size)
{
    size_t i;

    switch (Type)
    {
    case TYPE_EXPRSTRING:
    case TYPE_EXPRPARAM:
    case TYPE_STRING:
        if (!a) a = NullString;
        if (!b) b = NullString;
        return tcscmp(a,b)==0;

    case TYPE_ARRAY:
        return ArrayEq(a,b);

    case TYPE_FRACTION:
        if (a && b)
            return EqFrac((const cc_fraction*)a,(const cc_fraction*)b);
        break;
    }

    if (!a && !b)
        return 1;

    if (a && b)
        return memcmp(a,b,Size)==0;

    if (!a)
        a = b;

    for (i=0;i<Size;++i)
        if (((const uint8_t*)a)[i])
            return 0;

    return 1;
}